

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxel.h
# Opt level: O2

voxel __thiscall ocmesh::details::voxel::neighbor(voxel *this,face d)

{
  u16vec3 uVar1;
  tvec3<unsigned_short,_(glm::precision)0> coordinates_00;
  unsigned_short *puVar2;
  ushort scalar;
  uint uVar3;
  ushort uVar4;
  undefined7 in_register_00000031;
  ushort uVar5;
  length_type i;
  u16vec3 coordinates;
  voxel local_30;
  
  uVar3 = (uint)CONCAT71(in_register_00000031,d);
  i = 0;
  if (right < d) {
    i = ((d & ~right) != bottom) + 1;
  }
  uVar1 = voxel::coordinates(this);
  coordinates._0_4_ = uVar1._0_4_;
  coordinates.field_2 = uVar1.field_2;
  if (uVar3 < 6) {
    if ((0x2aU >> (uVar3 & 0x1f) & 1) != 0) {
      puVar2 = glm::tvec3<unsigned_short,_(glm::precision)0>::operator[](&coordinates,i);
      scalar = 1;
      uVar4 = (ushort)(1 << (0xd - ((byte)((uint)this->_code >> 0x15) & 0xf) & 0x1f));
      if (!CARRY2(*puVar2,uVar4)) goto LAB_00104734;
      if ((d < (back|bottom)) && ((0x2aU >> (d & 0x1f) & 1) != 0)) {
        scalar = 0;
        goto LAB_00104734;
      }
    }
  }
  puVar2 = glm::tvec3<unsigned_short,_(glm::precision)0>::operator[](&coordinates,i);
  scalar = (ushort)(*puVar2 != 0);
  uVar4 = (ushort)(1 << (0xd - ((byte)((uint)this->_code >> 0x15) & 0xf) & 0x1f));
LAB_00104734:
  uVar5 = 0xffff;
  if ((d & ~bottom) == right) {
    uVar5 = uVar4;
  }
  if (d == front) {
    uVar5 = uVar4;
  }
  puVar2 = glm::tvec3<unsigned_short,_(glm::precision)0>::operator[](&coordinates,i);
  *puVar2 = *puVar2 + uVar5 * scalar;
  coordinates_00 = glm::operator*(scalar,&coordinates);
  voxel(&local_30,coordinates_00,(char)scalar * '\r',((uint)this->_code & 0x1fffff) * (uint)scalar);
  return (voxel)local_30._code;
}

Assistant:

inline
voxel voxel::neighbor(face d) const
{
    /*
     * This will maybe be the most frequently called function in the entire
     * application, so we have to increase a bit its complexity to avoid
     * branches. Everything is computed in one linear flow control.
     */
    // First we choose if we need to add the size or subtract 1
    bool add_size = d == right  ||
                    d == top    ||
                    d == front;
    
    // Select the index of the coordinate to change.
    // Note: these ternary operators are probably not compiled as branches
    // TODO: Check the above statement
    uint8_t index = d == left || d == right  ? 0 :
                    d == top  || d == bottom ? 1 : 2 ;
    
    // Get the coordinates of the voxel
    glm::u16vec3 coordinates = this->coordinates();
    
    // Check if we have a neighbor at all
    uint16_t has_neighbor =
        (add_size && add_is_safe(coordinates[index], size())) ||
        (!add_size && coordinates[index] > 0);
    
    // We add the size if add_size is true,
    // or we add -1 if add_size is false,
    // but only if the neighbor actually exists
    coordinates[index] += has_neighbor * (add_size * size() - (!add_size));

    // Build the new voxel. If has_neighbor is false we obtain a void voxel.
    return voxel(has_neighbor * coordinates,
                 has_neighbor * max_level,
                 has_neighbor * material());
}